

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::ProcessLineDefs(UDMFParser *this)

{
  double *pdVar1;
  double dVar2;
  vertex_t *pvVar3;
  vertex_t *pvVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  uint uVar8;
  int iVar9;
  line_t *plVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  short *alpha;
  DWORD *pDVar15;
  DWORD *pDVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  byte bVar20;
  int local_68;
  short tempalpha [2];
  
  bVar20 = 0;
  uVar17 = (this->ParsedLines).Count;
  local_68 = 0;
  if (uVar17 != 0) {
    local_68 = 0;
    uVar11 = 0;
    iVar18 = 0;
    do {
      uVar17 = (uint)uVar11;
      plVar10 = (this->ParsedLines).Array;
      pvVar3 = plVar10[uVar11].v1;
      pvVar4 = plVar10[uVar11].v2;
      if (((long)pvVar3 < (long)numvertexes) &&
         (-1 < (long)((ulong)pvVar3 | (ulong)pvVar4) && (long)pvVar4 < (long)numvertexes)) {
        if (pvVar3 != pvVar4) {
          dVar2 = vertexes[(long)pvVar3].p.X;
          if ((((dVar2 != vertexes[(long)pvVar4].p.X) ||
               (NAN(dVar2) || NAN(vertexes[(long)pvVar4].p.X))) ||
              (dVar2 = vertexes[(long)pvVar3].p.Y, pdVar1 = &vertexes[(long)pvVar4].p.Y,
              dVar2 != *pdVar1)) || (NAN(dVar2) || NAN(*pdVar1))) {
            plVar10 = plVar10 + uVar11;
            plVar10->v1 = vertexes + (long)pvVar3;
            plVar10->v2 = vertexes + (long)pvVar4;
            local_68 = ((local_68 - (uint)(plVar10->sidedef[0] == (side_t *)0x0)) + 2) -
                       (uint)(plVar10->sidedef[1] == (side_t *)0x0);
            TArray<int,_int>::Grow(&linemap,1);
            linemap.Array[linemap.Count] = uVar17 + iVar18;
            linemap.Count = linemap.Count + 1;
            uVar11 = (ulong)(uVar17 + 1);
            goto LAB_0055481a;
          }
        }
        Printf("Removing 0-length line %d\n",(ulong)(uVar17 + iVar18));
        uVar8 = (this->ParsedLines).Count;
        if (uVar17 < uVar8) {
          uVar8 = uVar8 - 1;
          (this->ParsedLines).Count = uVar8;
          if (uVar17 <= uVar8 && uVar8 - uVar17 != 0) {
            plVar10 = (this->ParsedLines).Array;
            memmove(plVar10 + uVar11,plVar10 + (uVar17 + 1),(ulong)(uVar8 - uVar17) * 0x98);
          }
        }
        ForceNodeBuild = true;
        iVar18 = iVar18 + 1;
      }
      else {
        I_Error("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.",
                (ulong)(uVar17 + iVar18));
      }
LAB_0055481a:
      uVar17 = (this->ParsedLines).Count;
    } while ((uint)uVar11 < uVar17);
  }
  numsides = local_68;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(int)uVar17;
  uVar11 = SUB168(auVar6 * ZEXT816(0x98),0);
  if (SUB168(auVar6 * ZEXT816(0x98),8) != 0) {
    uVar11 = 0xffffffffffffffff;
  }
  numlines = uVar17;
  lines = (line_t *)operator_new__(uVar11);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)local_68;
  uVar11 = 0xffffffffffffffff;
  if (SUB168(auVar7 * ZEXT816(0xd8),8) == 0) {
    uVar11 = SUB168(auVar7 * ZEXT816(0xd8),0);
  }
  sides = (side_t *)operator_new__(uVar11);
  iVar18 = 0;
  if (0 < numlines) {
    lVar13 = 0;
    lVar14 = 0x48;
    iVar18 = 0;
    do {
      tempalpha[0] = -0x8000;
      tempalpha[1] = -0x8000;
      plVar10 = (this->ParsedLines).Array + lVar13;
      pvVar3 = plVar10->v2;
      pDVar16 = &lines[lVar13].flags;
      ((line_t *)(pDVar16 + -8))->v1 = plVar10->v1;
      *(vertex_t **)(pDVar16 + -6) = pvVar3;
      *(double *)(pDVar16 + -2) = (plVar10->delta).Y;
      ((DVector2 *)(pDVar16 + -4))->X = (plVar10->delta).X;
      pDVar15 = &plVar10->flags;
      for (lVar12 = 0xf; lVar12 != 0; lVar12 = lVar12 + -1) {
        *(undefined8 *)pDVar16 = *(undefined8 *)pDVar15;
        pDVar15 = pDVar15 + ((ulong)bVar20 * -2 + 1) * 2;
        pDVar16 = pDVar16 + (ulong)bVar20 * -4 + 2;
      }
      lVar19 = 1;
      alpha = tempalpha;
      lVar12 = lVar14;
      do {
        lVar5 = *(long *)((long)lines->args + lVar12 + -0x2c);
        if (lVar5 != 0) {
          iVar9 = (int)lVar5;
          if (local_68 < iVar9) {
            *(undefined8 *)((long)lines->args + lVar12 + -0x2c) = 0;
          }
          else {
            iVar9 = iVar9 + -1;
            memcpy(sides + iVar18,(this->ParsedSides).Array + iVar9,0xd4);
            sides[iVar18].linedef = lines + lVar13;
            sides[iVar18].sector = sectors + (long)sides[iVar18].sector;
            *(side_t **)((long)lines->args + lVar12 + -0x2c) = sides + iVar18;
            P_ProcessSideTextures
                      ((bool)(this->isExtended ^ 1),sides + iVar18,sides[iVar18].sector,
                       (this->ParsedSideTextures).Array + iVar9,lines[lVar13].special,
                       lines[lVar13].args[0],alpha,this->missingTex);
            iVar18 = iVar18 + 1;
          }
        }
        alpha = alpha + 1;
        lVar12 = lVar12 + 8;
        lVar19 = lVar19 + -1;
      } while (lVar19 == 0);
      P_AdjustLine(lines + lVar13);
      P_FinishLoadingLineDef(lines + lVar13,(int)tempalpha[0]);
      lVar13 = lVar13 + 1;
      lVar14 = lVar14 + 0x98;
    } while (lVar13 < numlines);
  }
  if (numsides < iVar18) {
    __assert_fail("side <= numsides",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/p_udmf.cpp"
                  ,0x6ec,"void UDMFParser::ProcessLineDefs()");
  }
  if (iVar18 < numsides) {
    Printf("Map had %d invalid side references\n");
    numsides = iVar18;
  }
  return;
}

Assistant:

void ProcessLineDefs()
	{
		int sidecount = 0;
		for(unsigned i = 0, skipped = 0; i < ParsedLines.Size();)
		{
			// Relocate the vertices
			intptr_t v1i = intptr_t(ParsedLines[i].v1);
			intptr_t v2i = intptr_t(ParsedLines[i].v2);

			if (v1i >= numvertexes || v2i >= numvertexes || v1i < 0 || v2i < 0)
			{
				I_Error ("Line %d has invalid vertices: %zd and/or %zd.\nThe map only contains %d vertices.", i+skipped, v1i, v2i, numvertexes);
			}
			else if (v1i == v2i ||
				(vertexes[v1i].fX() == vertexes[v2i].fX() && vertexes[v1i].fY() == vertexes[v2i].fY()))
			{
				Printf ("Removing 0-length line %d\n", i+skipped);
				ParsedLines.Delete(i);
				ForceNodeBuild = true;
				skipped++;
			}
			else
			{
				ParsedLines[i].v1 = &vertexes[v1i];
				ParsedLines[i].v2 = &vertexes[v2i];

				if (ParsedLines[i].sidedef[0] != NULL)
					sidecount++;
				if (ParsedLines[i].sidedef[1] != NULL)
					sidecount++;
				linemap.Push(i+skipped);
				i++;
			}
		}
		numlines = ParsedLines.Size();
		numsides = sidecount;
		lines = new line_t[numlines];
		sides = new side_t[numsides];
		int line, side;

		for(line = 0, side = 0; line < numlines; line++)
		{
			short tempalpha[2] = { SHRT_MIN, SHRT_MIN };

			lines[line] = ParsedLines[line];

			for(int sd = 0; sd < 2; sd++)
			{
				if (lines[line].sidedef[sd] != NULL)
				{
					int mapside = int(intptr_t(lines[line].sidedef[sd]))-1;
					if (mapside < sidecount)
					{
						sides[side] = ParsedSides[mapside];
						sides[side].linedef = &lines[line];
						sides[side].sector = &sectors[intptr_t(sides[side].sector)];
						lines[line].sidedef[sd] = &sides[side];

						P_ProcessSideTextures(!isExtended, &sides[side], sides[side].sector, &ParsedSideTextures[mapside],
							lines[line].special, lines[line].args[0], &tempalpha[sd], missingTex);

						side++;
					}
					else
					{
						lines[line].sidedef[sd] = NULL;
					}
				}
			}

			P_AdjustLine(&lines[line]);
			P_FinishLoadingLineDef(&lines[line], tempalpha[0]);
		}
		assert(side <= numsides);
		if (side < numsides)
		{
			Printf("Map had %d invalid side references\n", numsides - side);
			numsides = side;
		}
	}